

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cepstrum_to_autocorrelation.cc
# Opt level: O2

void __thiscall
sptk::CepstrumToAutocorrelation::CepstrumToAutocorrelation
          (CepstrumToAutocorrelation *this,int num_input_order,int num_output_order,int fft_length)

{
  this->_vptr_CepstrumToAutocorrelation = (_func_int **)&PTR__CepstrumToAutocorrelation_00112be0;
  this->num_input_order_ = num_input_order;
  this->num_output_order_ = num_output_order;
  RealValuedFastFourierTransform::RealValuedFastFourierTransform
            (&this->fast_fourier_transform_,fft_length);
  this->is_valid_ = true;
  if ((((this->num_input_order_ < 0) || (fft_length <= this->num_output_order_)) ||
      (fft_length <= this->num_input_order_)) ||
     ((this->num_output_order_ < 0 || ((this->fast_fourier_transform_).is_valid_ == false)))) {
    this->is_valid_ = false;
  }
  return;
}

Assistant:

CepstrumToAutocorrelation::CepstrumToAutocorrelation(int num_input_order,
                                                     int num_output_order,
                                                     int fft_length)
    : num_input_order_(num_input_order),
      num_output_order_(num_output_order),
      fast_fourier_transform_(fft_length),
      is_valid_(true) {
  if (num_input_order_ < 0 || num_output_order_ < 0 ||
      fft_length <= num_input_order_ || fft_length <= num_output_order_ ||
      !fast_fourier_transform_.IsValid()) {
    is_valid_ = false;
    return;
  }
}